

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall SQClass::SQClass(SQClass *this,SQVM *v,SQClass *base)

{
  SQUnsignedInteger *pSVar1;
  undefined8 *puVar2;
  SQAllocContext pSVar3;
  SQSharedState *ss;
  SQInteger SVar4;
  long lVar5;
  SQTable *pSVar6;
  EVP_PKEY_CTX *src;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClass_0019a158;
  pSVar3 = v->_sharedstate->_alloc_ctx;
  (this->_defaultvalues)._vals = (SQClassMember *)0x0;
  (this->_defaultvalues)._alloc_ctx = pSVar3;
  (this->_defaultvalues)._size = 0;
  (this->_defaultvalues)._allocated = 0;
  (this->_methods)._vals = (SQClassMember *)0x0;
  (this->_methods)._alloc_ctx = pSVar3;
  (this->_methods)._size = 0;
  (this->_methods)._allocated = 0;
  lVar5 = 0x70;
  do {
    puVar2 = (undefined8 *)
             ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                     super_SQRefCounted._vptr_SQRefCounted + lVar5);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined4 *)
     ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).super_SQRefCounted.
             _vptr_SQRefCounted + lVar5) = 0x1000001;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x180);
  ss = v->_sharedstate;
  this->_base = base;
  this->_udsize = 0;
  this->_lockedTypeId = 0;
  this->_typetag = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  this->_constructoridx = -1;
  if (base == (SQClass *)0x0) {
    pSVar6 = SQTable::Create(ss,0);
  }
  else {
    SVar4 = base->_udsize;
    this->_constructoridx = base->_constructoridx;
    this->_udsize = SVar4;
    sqvector<SQClassMember,_unsigned_int>::copy
              (&this->_defaultvalues,(EVP_PKEY_CTX *)&base->_defaultvalues,(EVP_PKEY_CTX *)base);
    sqvector<SQClassMember,_unsigned_int>::copy(&this->_methods,(EVP_PKEY_CTX *)&base->_methods,src)
    ;
    for (lVar5 = 0x70; lVar5 != 0x180; lVar5 = lVar5 + 0x10) {
      SQObjectPtr::operator=
                ((SQObjectPtr *)
                 ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                         super_SQRefCounted._vptr_SQRefCounted + lVar5),
                 (SQObjectPtr *)
                 ((long)&(((SQClass *)(base->_metamethods + -7))->super_SQCollectable).
                         super_SQRefCounted._vptr_SQRefCounted + lVar5));
    }
    pSVar1 = &(this->_base->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    pSVar6 = SQTable::Clone(base->_members);
  }
  this->_members = pSVar6;
  pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  (this->super_SQCollectable)._gc_next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._gc_prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQClass::SQClass(SQVM *v, SQClass *base) :
    _defaultvalues(_ss(v)->_alloc_ctx),
    _methods(_ss(v)->_alloc_ctx)
{
    SQSharedState *ss = _ss(v);

    _base = base;
    _typetag = 0;
    _hook = NULL;
    _udsize = 0;
    _constructoridx = -1;
    _lockedTypeId = 0;
    if(_base) {
        _constructoridx = _base->_constructoridx;
        _udsize = _base->_udsize;
        _defaultvalues.copy(base->_defaultvalues);
        _methods.copy(base->_methods);
        _COPY_VECTOR(_metamethods,base->_metamethods,MT_NUM_METHODS);
        __ObjAddRef(_base);
    }
    _members = base?base->_members->Clone() : SQTable::Create(ss,0);
    __ObjAddRef(_members);

    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain, this);
}